

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

_Bool upb_Map_Get(upb_Map *map,upb_MessageValue key,upb_MessageValue *val)

{
  _Bool _Var1;
  upb_MessageValue *val_local;
  upb_Map *map_local;
  upb_MessageValue key_local;
  
  key_local.int64_val = key.str_val.size;
  map_local = key.map_val;
  _Var1 = _upb_Map_Get(map,&map_local,(long)map->key_size,val,(long)map->val_size);
  return _Var1;
}

Assistant:

bool upb_Map_Get(const upb_Map* map, upb_MessageValue key,
                 upb_MessageValue* val) {
  return _upb_Map_Get(map, &key, map->key_size, val, map->val_size);
}